

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O1

int duckdb::History::SetMaxLength(idx_t len)

{
  void *__ptr;
  ulong uVar1;
  void *__s;
  int iVar2;
  idx_t j;
  long lVar3;
  ulong uVar4;
  
  uVar1 = history_len;
  __ptr = history;
  iVar2 = 0;
  if (len != 0) {
    if (history != (void *)0x0) {
      __s = malloc(len * 8);
      if (__s == (void *)0x0) {
        return 0;
      }
      uVar4 = uVar1;
      if (len < uVar1) {
        lVar3 = 0;
        do {
          free(*(void **)((long)__ptr + lVar3 * 8));
          lVar3 = lVar3 + 1;
          uVar4 = len;
        } while (uVar1 - len != lVar3);
      }
      switchD_00570541::default(__s,0,len * 8);
      switchD_00b1522a::default(__s,(void *)((long)__ptr + (uVar1 - uVar4) * 8),uVar4 << 3);
      free(__ptr);
      history = __s;
    }
    iVar2 = 1;
    history_max_len = len;
    if (len < history_len) {
      history_len = len;
    }
  }
  return iVar2;
}

Assistant:

int History::SetMaxLength(idx_t len) {
	char **new_entry;

	if (len < 1) {
		return 0;
	}
	if (history) {
		idx_t tocopy = history_len;

		new_entry = (char **)malloc(sizeof(char *) * len);
		if (new_entry == nullptr) {
			return 0;
		}

		/* If we can't copy everything, free the elements we'll not use. */
		if (len < tocopy) {
			for (idx_t j = 0; j < tocopy - len; j++) {
				free(history[j]);
			}
			tocopy = len;
		}
		memset(new_entry, 0, sizeof(char *) * len);
		memcpy(new_entry, history + (history_len - tocopy), sizeof(char *) * tocopy);
		free(history);
		history = new_entry;
	}
	history_max_len = len;
	if (history_len > history_max_len) {
		history_len = history_max_len;
	}
	return 1;
}